

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O1

QString * AbstractStringSerialiserPrivate::saveImageVariant
                    (QString *__return_storage_ptr__,QImage *imageData)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  QByteArray byteArray;
  QBuffer buffer;
  QByteArray local_58;
  QArrayData *local_38;
  char *local_30;
  QBuffer local_20 [16];
  
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char *)0x0;
  local_58.d.size = 0;
  QBuffer::QBuffer(local_20,&local_58,(QObject *)0x0);
  QImage::save((QIODevice *)imageData,(char *)local_20,0x1519c8);
  QByteArray::toBase64(&local_38,&local_58,0);
  if (local_30 == (char *)0x0) {
    local_30 = (char *)&QByteArray::_empty;
  }
  psVar1 = (storage_type *)strlen(local_30);
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)__return_storage_ptr__;
  QString::fromLatin1(QVar2);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,1,8);
    }
  }
  QBuffer::~QBuffer(local_20);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString AbstractStringSerialiserPrivate::saveImageVariant(const QImage &imageData)
{
    QByteArray byteArray;
    QBuffer buffer(&byteArray);
    imageData.save(&buffer, "PNG");
    return QString::fromLatin1(byteArray.toBase64().constData());
}